

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb99.c
# Opt level: O3

err_t stb99RiVal(stb99_seed *seed,size_t r)

{
  ulong uVar1;
  err_t eVar2;
  long lVar3;
  
  if (seed->ri[0] == r) {
    lVar3 = 0;
    while (uVar1 = seed->ri[lVar3 + 1], 0x10 < uVar1) {
      if (0x3333333333333332 < uVar1) {
        return 0x20c;
      }
      if (uVar1 * 2 < seed->ri[lVar3]) {
        return 0x20c;
      }
      if (seed->ri[lVar3] * 4 - 0x10 <= uVar1 * 5) {
        return 0x20c;
      }
      lVar3 = lVar3 + 1;
      if (lVar3 == 9) {
        eVar2 = 0x20c;
        if (seed->ri[9] < 0x21) {
          eVar2 = 0;
        }
        return eVar2;
      }
    }
    if (seed->ri[lVar3] < 0x21) {
      if (lVar3 + 1U < 10) {
        do {
          if (seed->ri[lVar3 + 1] != 0) {
            return 0x20c;
          }
          lVar3 = lVar3 + 1;
        } while (lVar3 != 9);
      }
      return 0;
    }
  }
  return 0x20c;
}

Assistant:

static err_t stb99RiVal(const stb99_seed* seed, size_t r)
{
	size_t i;
	// проверить ri[0]
	if (seed->ri[0] != r)
		return ERR_BAD_SEED;
	ASSERT(seed->ri[0] > 16);
	// проверить цепочку ri
	for (i = 1; i < COUNT_OF(seed->ri) && seed->ri[i] > 16; ++i)
		if (seed->ri[i] >= SIZE_MAX / 5 ||
			seed->ri[i - 1] > 2 * seed->ri[i] ||
			5 * seed->ri[i] >= 4 * seed->ri[i - 1] - 16)
			return ERR_BAD_SEED;
	if (seed->ri[i - 1] > 32)
		return ERR_BAD_SEED;
	for (; i < COUNT_OF(seed->ri); ++i)
		if (seed->ri[i] != 0)
			return ERR_BAD_SEED;
	// все хорошо
	return ERR_OK;
}